

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O2

int envy_bios_parse_hdtvtt(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  envy_bios_hdtvtt_entry *peVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *__format;
  
  uVar3 = (bios->hdtvtt).offset;
  if (uVar3 == 0) {
    return 0;
  }
  iVar4 = bios_u8(bios,(uint)uVar3,&(bios->hdtvtt).version);
  res = &(bios->hdtvtt).hlen;
  iVar5 = bios_u8(bios,(bios->hdtvtt).offset + 1,res);
  iVar6 = bios_u8(bios,(bios->hdtvtt).offset + 2,&(bios->hdtvtt).entriesnum);
  res_00 = &(bios->hdtvtt).rlen;
  iVar7 = bios_u8(bios,(bios->hdtvtt).offset + 3,res_00);
  if (iVar7 == 0 && (iVar6 == 0 && (iVar5 == 0 && iVar4 == 0))) {
    envy_bios_block(bios,(uint)(bios->hdtvtt).offset,
                    (uint)(bios->hdtvtt).entriesnum * (uint)(bios->hdtvtt).rlen +
                    (uint)(bios->hdtvtt).hlen,"HDTVTT",-1);
    bVar1 = (bios->hdtvtt).version;
    if ((bVar1 & 0xfe) == 0x10) {
      bVar1 = *res;
      uVar10 = (ulong)bVar1;
      uVar11 = 4;
      if (9 < bVar1) {
        uVar11 = 10;
      }
      uVar9 = (uint)uVar11;
      if (uVar9 < bVar1 || uVar9 == bVar1) {
        bVar2 = *res_00;
        if (1 < bVar2) {
          if (uVar9 < bVar1) {
            fprintf(_stderr,"HDTVTT table header longer than expected [%d > %d]\n");
            bVar2 = *res_00;
          }
          if (2 < bVar2) {
            fprintf(_stderr,"HDTVTT table record longer than expected [%d > %d]\n",(ulong)bVar2);
          }
          uVar11 = (ulong)(bios->hdtvtt).entriesnum;
          peVar8 = (envy_bios_hdtvtt_entry *)calloc(uVar11,2);
          (bios->hdtvtt).entries = peVar8;
          if (peVar8 == (envy_bios_hdtvtt_entry *)0x0) {
            return -0xc;
          }
          for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
            peVar8[uVar10].offset =
                 (ushort)(bios->hdtvtt).rlen * (short)uVar10 +
                 (ushort)(bios->hdtvtt).hlen + (bios->hdtvtt).offset;
          }
          (bios->hdtvtt).valid = '\x01';
          return 0;
        }
        __format = "HDTVTT table record too short [%d < %d]\n";
        uVar11 = 2;
        uVar10 = (ulong)(uint)bVar2;
      }
      else {
        __format = "HDTVTT table header too short [%d < %d]\n";
      }
    }
    else {
      uVar10 = (ulong)(bVar1 >> 4);
      uVar11 = (ulong)(bVar1 & 0xf);
      __format = "Unknown HDTVTT table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar10,uVar11);
    iVar4 = -0x16;
  }
  else {
    iVar4 = -0xe;
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_hdtvtt (struct envy_bios *bios) {
	struct envy_bios_hdtvtt *hdtvtt = &bios->hdtvtt;
	if (!hdtvtt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, hdtvtt->offset, &hdtvtt->version);
	err |= bios_u8(bios, hdtvtt->offset+1, &hdtvtt->hlen);
	err |= bios_u8(bios, hdtvtt->offset+2, &hdtvtt->entriesnum);
	err |= bios_u8(bios, hdtvtt->offset+3, &hdtvtt->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, hdtvtt->offset, hdtvtt->hlen + hdtvtt->rlen * hdtvtt->entriesnum, "HDTVTT", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (hdtvtt->version) {
		case 0x10:
		case 0x11:
			wanthlen = 4;
			if (hdtvtt->hlen >= 10)
				wanthlen = 10;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown HDTVTT table version %d.%d\n", hdtvtt->version >> 4, hdtvtt->version & 0xf);
			return -EINVAL;
	}
	if (hdtvtt->hlen < wanthlen) {
		ENVY_BIOS_ERR("HDTVTT table header too short [%d < %d]\n", hdtvtt->hlen, wanthlen);
		return -EINVAL;
	}
	if (hdtvtt->rlen < wantrlen) {
		ENVY_BIOS_ERR("HDTVTT table record too short [%d < %d]\n", hdtvtt->rlen, wantrlen);
		return -EINVAL;
	}
	if (hdtvtt->hlen > wanthlen) {
		ENVY_BIOS_WARN("HDTVTT table header longer than expected [%d > %d]\n", hdtvtt->hlen, wanthlen);
	}
	if (hdtvtt->rlen > wantrlen) {
		ENVY_BIOS_WARN("HDTVTT table record longer than expected [%d > %d]\n", hdtvtt->rlen, wantrlen);
	}
	hdtvtt->entries = calloc(hdtvtt->entriesnum, sizeof *hdtvtt->entries);
	if (!hdtvtt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < hdtvtt->entriesnum; i++) {
		struct envy_bios_hdtvtt_entry *entry = &hdtvtt->entries[i];
		entry->offset = hdtvtt->offset + hdtvtt->hlen + hdtvtt->rlen * i;
	}
	hdtvtt->valid = 1;
	return 0;
}